

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress3.c
# Opt level: O2

void Abc_NtkAigToGiaOne(Gia_Man_t *p,Abc_Ntk_t *pNtk,Vec_Int_t *vMap)

{
  undefined4 uVar1;
  undefined8 *puVar2;
  uint __line;
  int iVar3;
  Abc_Obj_t *pAVar4;
  Gia_Obj_t *pGVar5;
  Vec_Ptr_t *p_00;
  long *plVar6;
  undefined4 *puVar7;
  int iVar8;
  long lVar9;
  Hop_Obj_t *pObj;
  char *__assertion;
  
  if ((pNtk->ntkFunc == ABC_FUNC_AIG) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
    puVar2 = (undefined8 *)pNtk->pManFunc;
    *(undefined4 *)puVar2[3] = 1;
    Abc_NtkCleanCopy(pNtk);
    for (iVar8 = 0; iVar8 < pNtk->vCis->nSize; iVar8 = iVar8 + 1) {
      pAVar4 = Abc_NtkCi(pNtk,iVar8);
      iVar3 = Vec_IntEntry(vMap,iVar8);
      iVar3 = Vec_IntEntry(p->vCis,iVar3);
      pGVar5 = Gia_ManObj(p,iVar3);
      iVar3 = Gia_ObjId(p,(Gia_Obj_t *)((ulong)pGVar5 & 0xfffffffffffffffe));
      iVar3 = Abc_Var2Lit(iVar3,(uint)pGVar5 & 1);
      (pAVar4->field_6).iTemp = iVar3;
    }
    p_00 = Abc_NtkDfs(pNtk,1);
    iVar8 = 0;
    while( true ) {
      if (p_00->nSize <= iVar8) {
        free(p_00->pArray);
        free(p_00);
        for (iVar8 = 0; iVar8 < pNtk->vCos->nSize; iVar8 = iVar8 + 1) {
          plVar6 = (long *)Vec_PtrEntry(pNtk->vCos,iVar8);
          Gia_ManAppendCo(p,*(int *)(*(long *)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                              (long)*(int *)plVar6[4] * 8) + 0x40));
        }
        return;
      }
      plVar6 = (long *)Vec_PtrEntry(p_00,iVar8);
      for (lVar9 = 0; lVar9 < *(int *)((long)plVar6 + 0x1c); lVar9 = lVar9 + 1) {
        uVar1 = *(undefined4 *)
                 (*(long *)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                           (long)*(int *)(plVar6[4] + lVar9 * 4) * 8) + 0x40);
        puVar7 = (undefined4 *)Vec_PtrEntry((Vec_Ptr_t *)*puVar2,(int)lVar9);
        *puVar7 = uVar1;
      }
      if (*(int *)(puVar2 + 10) < *(int *)((long)plVar6 + 0x1c)) break;
      pObj = (Hop_Obj_t *)(plVar6[7] & 0xfffffffffffffffe);
      iVar3 = Hop_DagSize(pObj);
      if (0 < iVar3) {
        Abc_ConvertHopToGia(p,pObj);
      }
      iVar3 = Abc_LitNotCond((pObj->field_0).iData,*(uint *)(plVar6 + 7) & 1);
      *(int *)(plVar6 + 8) = iVar3;
      iVar8 = iVar8 + 1;
    }
    __assertion = "Abc_ObjFaninNum(pNode) <= Hop_ManPiNum(pHopMan)";
    __line = 0x6e;
  }
  else {
    __assertion = "Abc_NtkIsAigLogic(pNtk)";
    __line = 0x60;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDress3.c"
                ,__line,"void Abc_NtkAigToGiaOne(Gia_Man_t *, Abc_Ntk_t *, Vec_Int_t *)");
}

Assistant:

void Abc_NtkAigToGiaOne( Gia_Man_t * p, Abc_Ntk_t * pNtk, Vec_Int_t * vMap )
{
    Hop_Man_t * pHopMan;
    Hop_Obj_t * pHopObj;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode, * pFanin;
    int i, k;
    assert( Abc_NtkIsAigLogic(pNtk) );
    pHopMan = (Hop_Man_t *)pNtk->pManFunc;
    Hop_ManConst1(pHopMan)->iData = 1;
    // image primary inputs
    Abc_NtkCleanCopy( pNtk );
    Abc_NtkForEachCi( pNtk, pNode, i )
        pNode->iTemp = Gia_ManCiLit(p, Vec_IntEntry(vMap, i));
    // iterate through nodes used in the mapping
    vNodes = Abc_NtkDfs( pNtk, 1 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        Abc_ObjForEachFanin( pNode, pFanin, k )
            Hop_ManPi(pHopMan, k)->iData = pFanin->iTemp;
        pHopObj = Hop_Regular( (Hop_Obj_t *)pNode->pData );
        assert( Abc_ObjFaninNum(pNode) <= Hop_ManPiNum(pHopMan) );
        if ( Hop_DagSize(pHopObj) > 0 )
            Abc_ConvertHopToGia( p, pHopObj );
        pNode->iTemp = Abc_LitNotCond( pHopObj->iData, Hop_IsComplement( (Hop_Obj_t *)pNode->pData ) );
    }
    Vec_PtrFree( vNodes );
    // create primary outputs
    Abc_NtkForEachCo( pNtk, pNode, i )
        Gia_ManAppendCo( p, Abc_ObjFanin0(pNode)->iTemp );
}